

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O3

void __thiscall libchess::Position::generate_castling(Position *this,MoveList *move_list,Color c)

{
  Square SVar1;
  ulong uVar2;
  iterator iVar3;
  Bitboard BVar4;
  PieceType pt;
  long lVar5;
  long lVar6;
  PieceType pt_1;
  long lVar7;
  PieceType pt_4;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  Bitboard BVar11;
  bool bVar12;
  Move local_48;
  Move local_44;
  ulong local_40;
  long local_38;
  
  uVar9 = this->color_bb_[0].value_;
  uVar2 = this->color_bb_[1].value_;
  BVar11.value_ = uVar2 | uVar9;
  lVar5 = (long)(int)c.super_MetaValueType<int>.value_;
  if (((*(uint *)(&DAT_00117fc0 + lVar5 * 8) &
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].castling_rights_.value_) != 0) &&
     (lVar7 = lVar5 * 0x10, (*(ulong *)(&DAT_00119c10 + lVar7) & BVar11.value_) == 0)) {
    SVar1.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bf0 + lVar7))->value_;
    lVar8 = (long)(int)SVar1.super_MetaValueType<int>.value_;
    uVar9 = (uVar9 & (&DAT_00144d48)[lVar8] | uVar2 & (&lookups::PAWN_ATTACKS)[lVar8]) &
            this->piece_type_bb_[0].value_;
    lVar6 = 1;
    do {
      BVar4 = lookups::non_pawn_piece_type_attacks
                        ((MetaValueType<int>)(value_type)lVar6,SVar1,BVar11);
      uVar9 = uVar9 | BVar4.value_ & this->piece_type_bb_[lVar6].value_;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    if ((this->color_bb_[c.super_MetaValueType<int>.value_ == 0].value_ & uVar9) == 0) {
      SVar1.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bd0 + lVar7))->value_;
      uVar9 = this->color_bb_[0].value_;
      uVar2 = this->color_bb_[1].value_;
      uVar10 = (uVar9 & (&DAT_00144d48)[(int)SVar1.super_MetaValueType<int>.value_] |
               uVar2 & (&lookups::PAWN_ATTACKS)[(int)SVar1.super_MetaValueType<int>.value_]) &
               this->piece_type_bb_[0].value_;
      lVar6 = 1;
      local_40 = (ulong)(c.super_MetaValueType<int>.value_ == 0);
      local_38 = lVar8;
      do {
        BVar4 = lookups::non_pawn_piece_type_attacks
                          ((MetaValueType<int>)(value_type)lVar6,SVar1,(Bitboard)(uVar2 | uVar9));
        uVar10 = uVar10 | BVar4.value_ & this->piece_type_bb_[lVar6].value_;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      if ((this->color_bb_[local_40].value_ & uVar10) == 0) {
        SVar1.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bd4 + lVar7))->value_;
        uVar9 = this->color_bb_[0].value_;
        uVar2 = this->color_bb_[1].value_;
        uVar10 = (uVar9 & (&DAT_00144d48)[(int)SVar1.super_MetaValueType<int>.value_] |
                 uVar2 & (&lookups::PAWN_ATTACKS)[(int)SVar1.super_MetaValueType<int>.value_]) &
                 this->piece_type_bb_[0].value_;
        lVar6 = 1;
        do {
          BVar4 = lookups::non_pawn_piece_type_attacks
                            ((MetaValueType<int>)(value_type)lVar6,SVar1,(Bitboard)(uVar2 | uVar9));
          uVar10 = uVar10 | BVar4.value_ & this->piece_type_bb_[lVar6].value_;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
        if ((this->color_bb_[local_40].value_ & uVar10) == 0) {
          local_48.value_ = *(int *)(&DAT_00119bf4 + lVar7) << 6 | (uint)local_38 | 0x10000;
          iVar3._M_current =
               (move_list->values_).
               super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (move_list->values_).
              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libchess::Move,std::allocator<libchess::Move>>::
            _M_realloc_insert<libchess::Move_const&>
                      ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar3,
                       &local_48);
          }
          else {
            (iVar3._M_current)->value_ = local_48.value_;
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
      }
    }
  }
  if (((*(uint *)(&DAT_00117fc4 + lVar5 * 8) &
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].castling_rights_.value_) != 0) &&
     (lVar5 = lVar5 * 0x10, (*(ulong *)(&DAT_00119c18 + lVar5) & BVar11.value_) == 0)) {
    SVar1.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bf0 + lVar5))->value_;
    uVar9 = this->color_bb_[0].value_;
    uVar2 = this->color_bb_[1].value_;
    uVar10 = (uVar9 & (&DAT_00144d48)[(int)SVar1.super_MetaValueType<int>.value_] |
             uVar2 & (&lookups::PAWN_ATTACKS)[(int)SVar1.super_MetaValueType<int>.value_]) &
             this->piece_type_bb_[0].value_;
    lVar7 = 1;
    do {
      BVar11 = lookups::non_pawn_piece_type_attacks
                         ((MetaValueType<int>)(value_type)lVar7,SVar1,(Bitboard)(uVar2 | uVar9));
      uVar10 = uVar10 | BVar11.value_ & this->piece_type_bb_[lVar7].value_;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    bVar12 = c.super_MetaValueType<int>.value_ == 0;
    if ((this->color_bb_[bVar12].value_ & uVar10) == 0) {
      SVar1.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bd8 + lVar5))->value_;
      uVar9 = this->color_bb_[0].value_;
      uVar2 = this->color_bb_[1].value_;
      uVar10 = (uVar9 & (&DAT_00144d48)[(int)SVar1.super_MetaValueType<int>.value_] |
               uVar2 & (&lookups::PAWN_ATTACKS)[(int)SVar1.super_MetaValueType<int>.value_]) &
               this->piece_type_bb_[0].value_;
      lVar7 = 1;
      do {
        BVar11 = lookups::non_pawn_piece_type_attacks
                           ((MetaValueType<int>)(value_type)lVar7,SVar1,(Bitboard)(uVar2 | uVar9));
        uVar10 = uVar10 | BVar11.value_ & this->piece_type_bb_[lVar7].value_;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      if ((this->color_bb_[bVar12].value_ & uVar10) == 0) {
        SVar1.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00119bdc + lVar5))->value_;
        uVar9 = this->color_bb_[0].value_;
        uVar2 = this->color_bb_[1].value_;
        uVar10 = (uVar9 & (&DAT_00144d48)[(int)SVar1.super_MetaValueType<int>.value_] |
                 uVar2 & (&lookups::PAWN_ATTACKS)[(int)SVar1.super_MetaValueType<int>.value_]) &
                 this->piece_type_bb_[0].value_;
        lVar7 = 1;
        do {
          BVar11 = lookups::non_pawn_piece_type_attacks
                             ((MetaValueType<int>)(value_type)lVar7,SVar1,(Bitboard)(uVar2 | uVar9))
          ;
          uVar10 = uVar10 | BVar11.value_ & this->piece_type_bb_[lVar7].value_;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        if ((this->color_bb_[bVar12].value_ & uVar10) == 0) {
          local_44.value_ =
               *(int *)(&DAT_00119bfc + lVar5) << 6 | *(uint *)(&DAT_00119bf8 + lVar5) | 0x10000;
          iVar3._M_current =
               (move_list->values_).
               super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (move_list->values_).
              super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libchess::Move,std::allocator<libchess::Move>>::
            _M_realloc_insert<libchess::Move_const&>
                      ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar3,
                       &local_44);
          }
          else {
            (iVar3._M_current)->value_ = local_44.value_;
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void Position::generate_castling(MoveList& move_list, Color c) const {
    const int castling_possibilities[2][2] = {
        {constants::WHITE_KINGSIDE.value(), constants::WHITE_QUEENSIDE.value()},
        {constants::BLACK_KINGSIDE.value(), constants::BLACK_QUEENSIDE.value()},
    };
    const Square castling_intermediate_sqs[2][2][2] = {
        {{constants::F1, constants::G1}, {constants::D1, constants::C1}},
        {{constants::F8, constants::G8}, {constants::D8, constants::C8}}};
    const Square castling_king_sqs[2][2][2] = {
        {{constants::E1, constants::G1}, {constants::E1, constants::C1}},
        {{constants::E8, constants::G8}, {constants::E8, constants::C8}}};
    const Bitboard castle_mask[2][2] = {
        {(Bitboard{constants::F1} | Bitboard{constants::G1}),
         (Bitboard{constants::D1} | Bitboard{constants::C1} | Bitboard{constants::B1})},
        {(Bitboard{constants::F8} | Bitboard{constants::G8}),
         (Bitboard{constants::D8} | Bitboard{constants::C8} | Bitboard{constants::B8})}};

    Bitboard occupancy = occupancy_bb();
    if ((castling_possibilities[c][0] & castling_rights().value()) &&
        !(castle_mask[c][0] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][0][0], castling_king_sqs[c][0][1], Move::Type::CASTLING});
    }
    if ((castling_possibilities[c][1] & castling_rights().value()) &&
        !(castle_mask[c][1] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][1][0], castling_king_sqs[c][1][1], Move::Type::CASTLING});
    }
}